

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

int xmlSchemaIsParticleEmptiable(xmlSchemaParticlePtr particle)

{
  xmlSchemaTypeType xVar1;
  xmlSchemaTreeItemPtr_conflict pxVar2;
  int iVar3;
  uint uVar4;
  xmlSchemaParticlePtr particle_00;
  
  iVar3 = 1;
  if ((((particle != (xmlSchemaParticlePtr)0x0) && (particle->minOccurs != 0)) &&
      (particle->children != (xmlSchemaTreeItemPtr_conflict)0x0)) &&
     (iVar3 = 0, particle->children->type - XML_SCHEMA_TYPE_SEQUENCE < 3)) {
    pxVar2 = particle->children;
    uVar4 = 1;
    if (((pxVar2 != (xmlSchemaTreeItemPtr_conflict)0x0) && (particle->minOccurs != 0)) &&
       (particle_00 = (xmlSchemaParticlePtr)pxVar2->children,
       particle_00 != (xmlSchemaParticlePtr)0x0)) {
      do {
        xVar1 = particle_00->children->type;
        if ((xVar1 == XML_SCHEMA_TYPE_ELEMENT) || (xVar1 == XML_SCHEMA_TYPE_ANY)) {
          uVar4 = (uint)(particle_00->minOccurs == 0);
        }
        else {
          uVar4 = xmlSchemaGetParticleEmptiable(particle_00);
        }
        if (pxVar2->type == XML_SCHEMA_TYPE_CHOICE) {
          if (uVar4 != 0) {
            return 1;
          }
        }
        else if (uVar4 == 0) {
          return 0;
        }
        particle_00 = (xmlSchemaParticlePtr)particle_00->next;
      } while (particle_00 != (xmlSchemaParticlePtr)0x0);
      uVar4 = (uint)(pxVar2->type != XML_SCHEMA_TYPE_CHOICE);
    }
    return uVar4;
  }
  return iVar3;
}

Assistant:

static int
xmlSchemaIsParticleEmptiable(xmlSchemaParticlePtr particle)
{
    /*
    * SPEC (1) "Its {min occurs} is 0."
    */
    if ((particle == NULL) || (particle->minOccurs == 0) ||
	(particle->children == NULL))
	return (1);
    /*
    * SPEC (2) "Its {term} is a group and the minimum part of the
    * effective total range of that group, [...] is 0."
    */
    if (WXS_IS_MODEL_GROUP(particle->children))
	return (xmlSchemaGetParticleEmptiable(particle));
    return (0);
}